

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O3

void __thiscall
wasm::SubTypes::SubTypes
          (SubTypes *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  pointer pHVar1;
  pointer pHVar2;
  
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&this->types,types);
  (this->typeSubTypes)._M_h._M_buckets = &(this->typeSubTypes)._M_h._M_single_bucket;
  (this->typeSubTypes)._M_h._M_bucket_count = 1;
  (this->typeSubTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeSubTypes)._M_h._M_element_count = 0;
  (this->typeSubTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->typeSubTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeSubTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pHVar1 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pHVar2 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
                .super__Vector_impl_data._M_start; pHVar2 != pHVar1; pHVar2 = pHVar2 + 1) {
    note(this,(HeapType)pHVar2->id);
  }
  return;
}

Assistant:

SubTypes(const std::vector<HeapType>& types) : types(types) {
    for (auto type : types) {
      note(type);
    }
  }